

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

string * __thiscall
slang::ast::EvalContext::dumpStack_abi_cxx11_(string *__return_storage_ptr__,EvalContext *this)

{
  long lVar1;
  const_iterator this_00;
  bool bVar2;
  size_t sVar3;
  string local_340;
  basic_string_view<char> local_320;
  ConstantValue *local_310;
  type *value;
  type *symbol;
  _Self local_2f8;
  const_iterator __end3;
  const_iterator __begin3;
  map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
  *__range3;
  char *local_2d8;
  int local_2d0 [4];
  basic_string_view<char> local_2c0;
  const_iterator local_2b0;
  Frame *frame;
  const_iterator __end2;
  const_iterator __begin2;
  SmallVector<slang::ast::EvalContext::Frame,_2UL> *__range2;
  undefined1 local_288 [4];
  int index;
  FormatBuffer buffer;
  EvalContext *this_local;
  
  buffer._536_8_ = this;
  FormatBuffer::FormatBuffer((FormatBuffer *)local_288);
  __range2._4_4_ = 0;
  __begin2 = (const_iterator)&this->stack;
  __end2 = SmallVectorBase<slang::ast::EvalContext::Frame>::begin
                     ((SmallVectorBase<slang::ast::EvalContext::Frame> *)__begin2);
  frame = SmallVectorBase<slang::ast::EvalContext::Frame>::end
                    ((SmallVectorBase<slang::ast::EvalContext::Frame> *)__begin2);
  for (; __end2 != frame; __end2 = __end2 + 1) {
    local_2b0 = __end2;
    sVar3 = std::char_traits<char>::length("{}: {}\n");
    local_2c0.size_ = sVar3;
    local_2d0[0] = __range2._4_4_;
    if (local_2b0->subroutine == (SubroutineSymbol *)0x0) {
      __range2._4_4_ = __range2._4_4_ + 1;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"<global>");
    }
    else {
      __range3 = (map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
                  *)(local_2b0->subroutine->super_Symbol).name._M_len;
      local_2d8 = (local_2b0->subroutine->super_Symbol).name._M_str;
      __range2._4_4_ = __range2._4_4_ + 1;
    }
    FormatBuffer::format<int,std::basic_string_view<char,std::char_traits<char>>const>
              ((FormatBuffer *)local_288,
               (format_string<int,_const_std::basic_string_view<char>_>)local_2c0,local_2d0,
               (basic_string_view<char,_std::char_traits<char>_> *)&__range3);
    this_00 = local_2b0;
    __end3 = std::
             map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
             ::begin(&local_2b0->temporaries);
    local_2f8._M_node =
         (_Base_ptr)
         std::
         map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
         ::end(&this_00->temporaries);
    while( true ) {
      bVar2 = std::operator!=(&__end3,&local_2f8);
      if (!bVar2) break;
      symbol = &std::
                _Rb_tree_const_iterator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>
                ::operator*(&__end3)->first;
      value = (type *)std::get<0ul,slang::ast::ValueSymbol_const*const,slang::ConstantValue>
                                ((pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue> *
                                 )symbol);
      local_310 = std::get<1ul,slang::ast::ValueSymbol_const*const,slang::ConstantValue>
                            ((pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue> *)
                             symbol);
      sVar3 = std::char_traits<char>::length("    {} = {}\n");
      local_320.size_ = sVar3;
      lVar1 = *(long *)&(value->value).
                        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        .
                        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ;
      slang::ConstantValue::toString_abi_cxx11_(&local_340,local_310);
      FormatBuffer::
      format<std::basic_string_view<char,std::char_traits<char>>const&,std::__cxx11::string>
                ((FormatBuffer *)local_288,
                 (format_string<const_std::basic_string_view<char>_&,_std::__cxx11::basic_string<char>_>
                  )local_320,(basic_string_view<char,_std::char_traits<char>_> *)(lVar1 + 8),
                 &local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::
      _Rb_tree_const_iterator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>
      ::operator++(&__end3);
    }
  }
  FormatBuffer::str_abi_cxx11_(__return_storage_ptr__,(FormatBuffer *)local_288);
  FormatBuffer::~FormatBuffer((FormatBuffer *)local_288);
  return __return_storage_ptr__;
}

Assistant:

std::string EvalContext::dumpStack() const {
    FormatBuffer buffer;
    int index = 0;
    for (const Frame& frame : stack) {
        buffer.format("{}: {}\n", index++, frame.subroutine ? frame.subroutine->name : "<global>");
        for (auto& [symbol, value] : frame.temporaries)
            buffer.format("    {} = {}\n", symbol->name, value.toString());
    }
    return buffer.str();
}